

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O1

void __thiscall
spdlog::details::registry::set_error_handler(registry *this,_func_void_string_ptr *handler)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    for (p_Var1 = (this->loggers_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
        p_Var1 = p_Var1->_M_nxt) {
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58._M_unused._M_object = (_func_void_string_ptr *)0x0;
      local_58._8_8_ = 0;
      if (handler != (_func_void_string_ptr *)0x0) {
        pcStack_40 = std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     ::_M_invoke;
        local_48 = std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   ::_M_manager;
        local_58._M_unused._0_8_ = (undefined8)handler;
      }
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator=((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)(p_Var1[5]._M_nxt + 9),
                  (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
      }
    }
    this->err_handler_ = handler;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

SPDLOG_INLINE void registry::set_error_handler(void (*handler)(const std::string &msg))
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    for (auto &l : loggers_)
    {
        l.second->set_error_handler(handler);
    }
    err_handler_ = handler;
}